

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFlatImage.cpp
# Opt level: O3

void anon_unknown.dwarf_bda6::verifyLevelsAreEqual
               (FlatImageLevel *level1,FlatImageLevel *level2,int dx,int dy)

{
  float *pfVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  _Base_ptr __n;
  undefined8 *puVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  _Rb_tree_node_base *p_Var10;
  _Rb_tree_node_base *p_Var11;
  _Rb_tree_node_base *p_Var12;
  ostream *poVar13;
  long lVar14;
  long lVar15;
  ArgExc *this;
  int iVar16;
  int iVar17;
  
  if ((((*(int *)(level1 + 0x18) == *(int *)(level2 + 0x18) - dx) &&
       (*(int *)(level1 + 0x1c) == *(int *)(level2 + 0x1c) - dy)) &&
      (*(int *)(level1 + 0x20) == *(int *)(level2 + 0x20) - dx)) &&
     (*(int *)(level1 + 0x24) == *(int *)(level2 + 0x24) - dy)) {
    p_Var10 = (_Rb_tree_node_base *)Imf_3_2::FlatImageLevel::begin();
    p_Var11 = (_Rb_tree_node_base *)Imf_3_2::FlatImageLevel::begin();
    p_Var12 = (_Rb_tree_node_base *)Imf_3_2::FlatImageLevel::end();
    if (p_Var10 != p_Var12) {
      do {
        p_Var12 = (_Rb_tree_node_base *)Imf_3_2::FlatImageLevel::end();
        if (p_Var11 == p_Var12) break;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"            channel ",0x14);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,*(char **)(p_Var10 + 1),
                             (long)p_Var10[1]._M_parent);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
        std::ostream::put((char)poVar13);
        std::ostream::flush();
        __n = p_Var10[1]._M_parent;
        if ((__n != p_Var11[1]._M_parent) ||
           ((__n != (_Base_ptr)0x0 &&
            (iVar8 = bcmp(*(void **)(p_Var10 + 1),*(void **)(p_Var11 + 1),(size_t)__n), iVar8 != 0))
           )) {
          this = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_2::ArgExc::ArgExc(this,"different channel names");
          goto LAB_00108331;
        }
        iVar8 = (**(code **)**(undefined8 **)(p_Var10 + 2))();
        iVar9 = (**(code **)**(undefined8 **)(p_Var11 + 2))();
        if (iVar8 != iVar9) {
          this = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_2::ArgExc::ArgExc(this,"different channel types");
          goto LAB_00108331;
        }
        puVar5 = *(undefined8 **)(p_Var10 + 2);
        lVar6 = *(long *)(p_Var11 + 2);
        if ((*(int *)(puVar5 + 2) != *(int *)(lVar6 + 0x10)) ||
           (*(int *)((long)puVar5 + 0x14) != *(int *)(lVar6 + 0x14))) {
          this = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_2::ArgExc::ArgExc(this,"different channel sampling rates");
          goto LAB_00108331;
        }
        if (*(char *)(puVar5 + 3) != *(char *)(lVar6 + 0x18)) {
          this = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_2::ArgExc::ArgExc(this,"different channel types");
          goto LAB_00108331;
        }
        iVar8 = (**(code **)*puVar5)();
        if (iVar8 == 0) {
          lVar6 = *(long *)(p_Var10 + 2);
          lVar14 = __dynamic_cast(lVar6,&Imf_3_2::FlatImageChannel::typeinfo,
                                  &Imf_3_2::TypedFlatImageChannel<unsigned_int>::typeinfo,0);
          if ((lVar14 == 0) ||
             (lVar15 = __dynamic_cast(*(undefined8 *)(p_Var11 + 2),
                                      &Imf_3_2::FlatImageChannel::typeinfo,
                                      &Imf_3_2::TypedFlatImageChannel<unsigned_int>::typeinfo,0),
             lVar15 == 0)) {
LAB_00108383:
            __cxa_bad_cast();
          }
          lVar7 = *(long *)(lVar6 + 8);
          iVar8 = *(int *)(lVar7 + 0x1c);
          iVar9 = *(int *)(lVar7 + 0x24);
          if (iVar8 <= iVar9) {
            iVar3 = *(int *)(lVar6 + 0x10);
            iVar4 = *(int *)(lVar6 + 0x14);
            iVar16 = *(int *)(lVar7 + 0x20);
            do {
              iVar17 = *(int *)(lVar7 + 0x18);
              if (iVar17 <= iVar16) {
                do {
                  Imf_3_2::ImageChannel::boundsCheck((int)lVar14,iVar17);
                  iVar9 = *(int *)(*(long *)(lVar14 + 0x38) +
                                  (long)(iVar17 / *(int *)(lVar14 + 0x10) +
                                        (iVar8 / *(int *)(lVar14 + 0x14)) * *(int *)(lVar14 + 0x1c))
                                  * 4);
                  iVar16 = dx + iVar17;
                  Imf_3_2::ImageChannel::boundsCheck((int)lVar15,iVar16);
                  if (iVar9 != *(int *)(*(long *)(lVar15 + 0x38) +
                                       (long)(iVar16 / *(int *)(lVar15 + 0x10) +
                                             ((iVar8 + dy) / *(int *)(lVar15 + 0x14)) *
                                             *(int *)(lVar15 + 0x1c)) * 4)) {
                    this = (ArgExc *)
                           __cxa_allocate_exception
                                     (0x48,*(long *)(lVar15 + 0x38),
                                      (long)iVar16 % (long)*(int *)(lVar15 + 0x10) & 0xffffffff);
                    Iex_3_2::ArgExc::ArgExc(this,"different pixel values");
                    goto LAB_00108331;
                  }
                  iVar17 = iVar17 + iVar3;
                  iVar16 = *(int *)(lVar7 + 0x20);
                } while (iVar17 <= iVar16);
                iVar9 = *(int *)(lVar7 + 0x24);
              }
              iVar8 = iVar8 + iVar4;
            } while (iVar8 <= iVar9);
          }
        }
        else if (iVar8 == 2) {
          lVar6 = *(long *)(p_Var10 + 2);
          lVar14 = __dynamic_cast(lVar6,&Imf_3_2::FlatImageChannel::typeinfo,
                                  &Imf_3_2::TypedFlatImageChannel<float>::typeinfo,0);
          if ((lVar14 == 0) ||
             (lVar15 = __dynamic_cast(*(undefined8 *)(p_Var11 + 2),
                                      &Imf_3_2::FlatImageChannel::typeinfo,
                                      &Imf_3_2::TypedFlatImageChannel<float>::typeinfo,0),
             lVar15 == 0)) goto LAB_00108383;
          lVar7 = *(long *)(lVar6 + 8);
          iVar8 = *(int *)(lVar7 + 0x1c);
          iVar9 = *(int *)(lVar7 + 0x24);
          if (iVar8 <= iVar9) {
            iVar3 = *(int *)(lVar6 + 0x10);
            iVar4 = *(int *)(lVar6 + 0x14);
            iVar16 = *(int *)(lVar7 + 0x20);
            do {
              iVar17 = *(int *)(lVar7 + 0x18);
              if (iVar17 <= iVar16) {
                do {
                  Imf_3_2::ImageChannel::boundsCheck((int)lVar14,iVar17);
                  fVar2 = *(float *)(*(long *)(lVar14 + 0x38) +
                                    (long)(iVar17 / *(int *)(lVar14 + 0x10) +
                                          (iVar8 / *(int *)(lVar14 + 0x14)) *
                                          *(int *)(lVar14 + 0x1c)) * 4);
                  iVar9 = dx + iVar17;
                  Imf_3_2::ImageChannel::boundsCheck((int)lVar15,iVar9);
                  pfVar1 = (float *)(*(long *)(lVar15 + 0x38) +
                                    (long)(iVar9 / *(int *)(lVar15 + 0x10) +
                                          ((iVar8 + dy) / *(int *)(lVar15 + 0x14)) *
                                          *(int *)(lVar15 + 0x1c)) * 4);
                  if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
                    this = (ArgExc *)
                           __cxa_allocate_exception
                                     (0x48,*(long *)(lVar15 + 0x38),
                                      (long)iVar9 % (long)*(int *)(lVar15 + 0x10) & 0xffffffff);
                    Iex_3_2::ArgExc::ArgExc(this,"different pixel values");
                    goto LAB_00108331;
                  }
                  iVar17 = iVar17 + iVar3;
                  iVar16 = *(int *)(lVar7 + 0x20);
                } while (iVar17 <= iVar16);
                iVar9 = *(int *)(lVar7 + 0x24);
              }
              iVar8 = iVar8 + iVar4;
            } while (iVar8 <= iVar9);
          }
        }
        else {
          if (iVar8 != 1) {
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testFlatImage.cpp"
                          ,0x66,
                          "void (anonymous namespace)::verifyLevelsAreEqual(const FlatImageLevel &, const FlatImageLevel &, int, int)"
                         );
          }
          verifyPixelsAreEqual<Imath_3_2::half>
                    (*(FlatImageChannel **)(p_Var10 + 2),*(FlatImageChannel **)(p_Var11 + 2),dx,dy);
        }
        p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
        p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
        p_Var12 = (_Rb_tree_node_base *)Imf_3_2::FlatImageLevel::end();
      } while (p_Var10 != p_Var12);
    }
    p_Var12 = (_Rb_tree_node_base *)Imf_3_2::FlatImageLevel::end();
    if ((p_Var10 == p_Var12) &&
       (p_Var10 = (_Rb_tree_node_base *)Imf_3_2::FlatImageLevel::end(), p_Var11 == p_Var10)) {
      return;
    }
    this = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc(this,"different channel lists");
  }
  else {
    this = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc(this,"different data windows");
  }
LAB_00108331:
  __cxa_throw(this,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
}

Assistant:

void
verifyLevelsAreEqual (
    const FlatImageLevel& level1, const FlatImageLevel& level2, int dx, int dy)
{
    if (level1.dataWindow ().min.x != level2.dataWindow ().min.x - dx ||
        level1.dataWindow ().min.y != level2.dataWindow ().min.y - dy ||
        level1.dataWindow ().max.x != level2.dataWindow ().max.x - dx ||
        level1.dataWindow ().max.y != level2.dataWindow ().max.y - dy)
    {
        throw ArgExc ("different data windows");
    }

    FlatImageLevel::ConstIterator i1 = level1.begin ();
    FlatImageLevel::ConstIterator i2 = level2.begin ();

    while (i1 != level1.end () && i2 != level2.end ())
    {
        cout << "            channel " << i1.name () << endl;

        if (i1.name () != i2.name ()) throw ArgExc ("different channel names");

        if (i1.channel ().pixelType () != i2.channel ().pixelType ())
            throw ArgExc ("different channel types");

        if (i1.channel ().xSampling () != i2.channel ().xSampling () ||
            i1.channel ().ySampling () != i2.channel ().ySampling ())
            throw ArgExc ("different channel sampling rates");

        if (i1.channel ().pLinear () != i2.channel ().pLinear ())
            throw ArgExc ("different channel types");

        switch (i1.channel ().pixelType ())
        {
            case HALF:

                verifyPixelsAreEqual<half> (
                    i1.channel (), i2.channel (), dx, dy);

                break;

            case FLOAT:

                verifyPixelsAreEqual<float> (
                    i1.channel (), i2.channel (), dx, dy);

                break;

            case UINT:

                verifyPixelsAreEqual<unsigned int> (
                    i1.channel (), i2.channel (), dx, dy);

                break;

            default: assert (false);
        }

        ++i1;
        ++i2;
    }

    if (i1 != level1.end () || i2 != level2.end ())
        throw ArgExc ("different channel lists");
}